

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O0

void redrawUnit(WINDOW *body,Inmate *inmate,Path *path,float oldPosition)

{
  char cVar1;
  int iVar2;
  int *piVar3;
  float fVar4;
  TileNode *pTStack_50;
  char type;
  TileNode *tNode;
  int setColor;
  float php;
  float mhp;
  float hp;
  int *newCoordinates;
  int *currentCoordinates;
  float oldPosition_local;
  Path *path_local;
  Inmate *inmate_local;
  WINDOW *body_local;
  
  malloc(8);
  malloc(8);
  fVar4 = ((float)inmate->currentHealth / (float)inmate->maxHealth) * 100.0;
  pTStack_50 = path->first;
  init_pair(1,7,0);
  init_pair(10,10,0);
  init_pair(0xb,0xb,0);
  init_pair(9,9,0);
  init_pair(5,5,0);
  for (; oldPosition < (float)pTStack_50->location; pTStack_50 = pTStack_50->next) {
  }
  cVar1 = pTStack_50->type;
  wbkgd(body,0x100);
  if (fVar4 <= 75.0) {
    if (fVar4 <= 50.0) {
      if (fVar4 <= 25.0) {
        tNode._0_4_ = 5;
      }
      else {
        tNode._0_4_ = 9;
      }
    }
    else {
      tNode._0_4_ = 0xb;
    }
  }
  else {
    tNode._0_4_ = 10;
  }
  wbkgd(body,0x100);
  piVar3 = getCoordinate((int)oldPosition);
  iVar2 = wmove(body,*piVar3,piVar3[1]);
  if (iVar2 != -1) {
    waddch(body,(int)cVar1);
  }
  piVar3 = getCoordinate((int)inmate->position);
  wbkgd(body,(int)tNode << 8);
  iVar2 = wmove(body,*piVar3,piVar3[1]);
  if (iVar2 != -1) {
    waddch(body,(int)inmate->type);
  }
  wbkgd(body,0x100);
  return;
}

Assistant:

void redrawUnit(WINDOW *body, struct Inmate *inmate, struct Path *path,
    float oldPosition) {
    int *currentCoordinates = malloc(sizeof(int) * 2);
    int *newCoordinates = malloc(sizeof(int) * 2);
    float hp, mhp, php;
    int setColor = GREEN;
    hp = (float) inmate->currentHealth;
    mhp = (float) inmate->maxHealth;
    php = (hp / mhp) * 100;
    struct TileNode *tNode = path->first;
    char type = tNode->type;

    init_pair(1, COLOR_WHITE, COLOR_BLACK);
    init_pair(GREEN, GREEN, COLOR_BLACK);
    init_pair(YELLOW, YELLOW, COLOR_BLACK);
    init_pair(RED, RED, COLOR_BLACK);
    init_pair(PURPLE, PURPLE, COLOR_BLACK);

    while (oldPosition < ((float) tNode->location)) {
        tNode = tNode->next;
    }
    type = tNode->type;

    wbkgd(body, COLOR_PAIR(1));

    if (php > 75.0) {
        setColor = GREEN;
    } else if (php > 50.0) {
        setColor = YELLOW;
    } else if (php > 25.0) {
        setColor = RED;
    } else {
        setColor = PURPLE;
    }

#ifndef _DEBUG
    /* Print movement debug information if the debug macro has been set */
    mvwprintw(
        body, 0, 1, "%d %d %f %f, %d, %d, %f, %f",
        newCoordinates[0], newCoordinates[1],
        inmate->position, php, inmate->currentHealth, inmate->maxHealth, hp, mhp
    );
#endif

    wbkgd(body, COLOR_PAIR(1));

    currentCoordinates = getCoordinate(oldPosition);
    mvwaddch(body, currentCoordinates[0], currentCoordinates[1], type);
    newCoordinates = getCoordinate(inmate->position);
    wbkgd(body, COLOR_PAIR(setColor));
    mvwaddch(body, newCoordinates[0], newCoordinates[1], inmate->type);
    wbkgd(body, COLOR_PAIR (1));
}